

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprVariableDefinitions *
AnalyzeVariableDefinitions(ExpressionContext *ctx,SynVariableDefinitions *syntax)

{
  uint uniqueId;
  SynVariableDefinition *allocator;
  ScopeData *scope;
  IntrusiveList<ExprBase> definitions_00;
  SynVariableDefinitions *source;
  SynVariableDefinitions *this;
  VariableData *this_00;
  TypeRef *type_00;
  SynIdentifier *this_01;
  ExprBase *node;
  ExprVariableDefinitions *this_02;
  uint local_6c;
  SynVariableDefinition *local_58;
  SynVariableDefinition *el;
  IntrusiveList<ExprBase> definitions;
  TypeBase *type;
  TypeBase *local_28;
  TypeBase *parentType;
  SynVariableDefinitions *pSStack_18;
  uint alignment;
  SynVariableDefinitions *syntax_local;
  ExpressionContext *ctx_local;
  
  pSStack_18 = syntax;
  syntax_local = (SynVariableDefinitions *)ctx;
  if (syntax->align == (SynAlign *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = AnalyzeAlignment(ctx,syntax->align);
  }
  parentType._4_4_ = local_6c;
  local_28 = (TypeBase *)((syntax_local[0x158].definitions.tail)->super_SynBase).pos.begin;
  if (local_28 != (TypeBase *)0x0) {
    ExpressionContext::PushTemporaryScope((ExpressionContext *)syntax_local);
    this = syntax_local;
    this_00 = ExpressionContext::get<VariableData>((ExpressionContext *)syntax_local);
    source = pSStack_18;
    allocator = syntax_local[0x170].definitions.head;
    scope = (ScopeData *)syntax_local[0x158].definitions.tail;
    type_00 = ExpressionContext::GetReferenceType((ExpressionContext *)syntax_local,local_28);
    this_01 = ExpressionContext::get<SynIdentifier>((ExpressionContext *)syntax_local);
    InplaceStr::InplaceStr((InplaceStr *)&type,"this");
    SynIdentifier::SynIdentifier(this_01,_type);
    uniqueId = *(uint *)((long)&syntax_local[0x170].super_SynBase.next + 4);
    *(uint *)((long)&syntax_local[0x170].super_SynBase.next + 4) = uniqueId + 1;
    VariableData::VariableData
              (this_00,(Allocator *)allocator,&source->super_SynBase,scope,0,
               &type_00->super_TypeBase,this_01,0,uniqueId);
    ExpressionContext::AddVariable((ExpressionContext *)this,this_00,true);
  }
  definitions.tail =
       (ExprBase *)AnalyzeType((ExpressionContext *)syntax_local,pSStack_18->type,true,(bool *)0x0);
  if (local_28 != (TypeBase *)0x0) {
    ExpressionContext::PopScope((ExpressionContext *)syntax_local,SCOPE_TEMPORARY);
  }
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&el);
  for (local_58 = (pSStack_18->definitions).head; local_58 != (SynVariableDefinition *)0x0;
      local_58 = getType<SynVariableDefinition>((local_58->super_SynBase).next)) {
    node = AnalyzeVariableDefinition
                     ((ExpressionContext *)syntax_local,local_58,parentType._4_4_,
                      (TypeBase *)definitions.tail);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&el,node);
  }
  this_02 = ExpressionContext::get<ExprVariableDefinitions>((ExpressionContext *)syntax_local);
  definitions_00.tail = definitions.head;
  definitions_00.head = (ExprBase *)el;
  ExprVariableDefinitions::ExprVariableDefinitions
            (this_02,&pSStack_18->super_SynBase,(TypeBase *)syntax_local[0x16f].super_SynBase.end,
             (TypeBase *)definitions.tail,definitions_00);
  return this_02;
}

Assistant:

ExprVariableDefinitions* AnalyzeVariableDefinitions(ExpressionContext &ctx, SynVariableDefinitions *syntax)
{
	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	TypeBase *parentType = ctx.scope->ownerType;

	if(parentType)
	{
		// Introduce 'this' variable into a temporary scope
		ctx.PushTemporaryScope();

		ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.GetReferenceType(parentType), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this")), 0, ctx.uniqueVariableId++), true);
	}

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(parentType)
		ctx.PopScope(SCOPE_TEMPORARY);

	IntrusiveList<ExprBase> definitions;

	for(SynVariableDefinition *el = syntax->definitions.head; el; el = getType<SynVariableDefinition>(el->next))
		definitions.push_back(AnalyzeVariableDefinition(ctx, el, alignment, type));

	return new (ctx.get<ExprVariableDefinitions>()) ExprVariableDefinitions(syntax, ctx.typeVoid, type, definitions);
}